

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

void mcmgfre(mcmcx1def *ctx,mcmon obj)

{
  ushort in_SI;
  mcmcx1def *in_RDI;
  mcmodef *o;
  mcmodef *facility;
  undefined6 in_stack_fffffffffffffff0;
  
  facility = in_RDI->mcmcxtab[(int)(uint)in_SI >> 8] + (int)(in_SI & 0xff);
  if (facility->mcmolcnt != '\0') {
    errsigf((errcxdef *)CONCAT26(in_SI,in_stack_fffffffffffffff0),(char *)facility,0);
  }
  if ((facility->mcmoflg & 0x10) != 0) {
    mcmunl(in_RDI,in_SI,&in_RDI->mcmcxlru);
  }
  mcmlnkhd(in_RDI,&in_RDI->mcmcxfre,in_SI);
  facility->mcmoflg = 0x80;
  return;
}

Assistant:

void mcmgfre(mcmcx1def *ctx, mcmon obj)
{
    mcmodef   *o = mcmgobje(ctx, obj);
    
    MCMGLBCTX(ctx);
    
    /* signal an error if the object is locked */
    if (o->mcmolcnt) errsig(ctx->mcmcxerr, ERR_LCKFRE);

    /* take out of LRU chain if it's in the chain */
    if (o->mcmoflg & MCMOFLRU) mcmunl(ctx, obj, &ctx->mcmcxlru);
    
    /* put it in the free list */
    mcmlnkhd(ctx, &ctx->mcmcxfre, obj);
    o->mcmoflg = MCMOFFREE;
}